

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs-libc.c
# Opt level: O2

JSValue js_os_remove(JSContext *ctx,JSValue this_val,int argc,JSValue *argv)

{
  int iVar1;
  char *__filename;
  ulong uVar2;
  JSValueUnion JVar3;
  int64_t iVar4;
  JSValue JVar5;
  
  __filename = JS_ToCString(ctx,*argv);
  if (__filename == (char *)0x0) {
    iVar4 = 6;
    JVar3.float64 = 0.0;
  }
  else {
    iVar1 = remove(__filename);
    uVar2 = js_get_errno((long)iVar1);
    JS_FreeCString(ctx,__filename);
    JVar3.ptr = (void *)(uVar2 & 0xffffffff);
    iVar4 = 0;
  }
  JVar5.tag = iVar4;
  JVar5.u.ptr = JVar3.ptr;
  return JVar5;
}

Assistant:

static JSValue js_os_remove(JSContext *ctx, JSValueConst this_val,
                             int argc, JSValueConst *argv)
{
    const char *filename;
    int ret;
    
    filename = JS_ToCString(ctx, argv[0]);
    if (!filename)
        return JS_EXCEPTION;
#if defined(_WIN32)
    {
        struct stat st;
        if (stat(filename, &st) == 0 && S_ISDIR(st.st_mode)) {
            ret = rmdir(filename);
        } else {
            ret = unlink(filename);
        }
    }
#else
    ret = remove(filename);
#endif
    ret = js_get_errno(ret);
    JS_FreeCString(ctx, filename);
    return JS_NewInt32(ctx, ret);
}